

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioScope.cpp
# Opt level: O0

void __thiscall AudioScope::paintEvent(AudioScope *this,QPaintEvent *evt)

{
  int iVar1;
  VisualizerBuffer *this_00;
  size_t sVar2;
  int __type;
  QLineF local_b8;
  QLineF local_98;
  float local_78;
  float local_74;
  float rightSample;
  float leftSample;
  int t;
  int end;
  float prevRight;
  float prevLeft;
  float index;
  float ratio;
  QPainter painter;
  int w;
  size_t size;
  Locked<VisualizerBuffer> handle;
  QPaintEvent *evt_local;
  AudioScope *this_local;
  
  handle.mRef = (VisualizerBuffer *)evt;
  QFrame::paintEvent((QPaintEvent *)this);
  if (this->mBuffer == (Guarded<VisualizerBuffer> *)0x0) {
    drawSilence(this);
  }
  else {
    Guarded<VisualizerBuffer>::access
              ((Guarded<VisualizerBuffer> *)&size,(char *)this->mBuffer,__type);
    this_00 = Locked<VisualizerBuffer>::operator->((Locked<VisualizerBuffer> *)&size);
    sVar2 = VisualizerBuffer::size(this_00);
    if (sVar2 == 0) {
      drawSilence(this);
    }
    else {
      iVar1 = QWidget::width((QWidget *)this);
      QPainter::QPainter((QPainter *)&index,(QPaintDevice *)&this->field_0x10);
      QPainter::setRenderHint((RenderHint)&index,true);
      QPainter::setPen((QColor *)&index);
      prevLeft = (float)(sVar2 & 0xffffffff) / (float)(iVar1 + -2);
      prevRight = 0.0;
      sample(this,(Locked<VisualizerBuffer> *)&size,0.0,prevLeft,(float *)&end,(float *)&t);
      leftSample = (float)(iVar1 + -1);
      for (rightSample = 2.8026e-45; (int)rightSample < (int)leftSample;
          rightSample = (float)((int)rightSample + 1)) {
        prevRight = prevRight + prevLeft;
        sample(this,(Locked<VisualizerBuffer> *)&size,prevRight,prevLeft,&local_74,&local_78);
        QLineF::QLineF(&local_98,(double)((int)rightSample + -1),(double)(float)end,
                       (double)(int)rightSample,(double)local_74);
        QPainter::drawLine((QPainter *)&index,&local_98);
        QLineF::QLineF(&local_b8,(double)((int)rightSample + -1),(double)(float)t,
                       (double)(int)rightSample,(double)local_78);
        QPainter::drawLine((QPainter *)&index,&local_b8);
        end = (int)local_74;
        t = (int)local_78;
      }
      QPainter::~QPainter((QPainter *)&index);
    }
    Locked<VisualizerBuffer>::~Locked((Locked<VisualizerBuffer> *)&size);
  }
  return;
}

Assistant:

void AudioScope::paintEvent(QPaintEvent *evt) {
    QFrame::paintEvent(evt);

    // it may be more efficient to do renderering in a separate thread
    // we can convert a sample buffer to a buffer of QLines, then
    // the paint event just draws the lines

    if (mBuffer == nullptr) {
        // no buffer, draw nothing
        drawSilence();
        return;
    }

    auto handle = mBuffer->access();
    auto size = handle->size();
    if (size == 0) {
        // buffer is empty, draw nothing
        drawSilence();
        return;
    }

    auto const w = width() - (TU::LINE_WIDTH * 2);
    
    QPainter painter(this);
    painter.setRenderHint(QPainter::Antialiasing);
    painter.setPen(mLineColor);

    // pixels per sample
    float ratio = (unsigned)size / (float)w;
    float index = 0;

    float prevLeft;
    float prevRight;
    sample(handle, 0.0f, ratio, prevLeft, prevRight);

    int const end = w + TU::LINE_WIDTH;
    for (int t = 1 + TU::LINE_WIDTH; t < end; ++t) {
        index += ratio;
        
        float leftSample;
        float rightSample;
        sample(handle, index, ratio, leftSample, rightSample);

        painter.drawLine(QLineF(t - 1, prevLeft, t, leftSample));
        painter.drawLine(QLineF(t - 1, prevRight, t, rightSample));

        prevLeft = leftSample;
        prevRight = rightSample;

        
    }
    
}